

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printLogicalImm32(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  byte bVar3;
  uint uVar4;
  MCOperand *op;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar5 = MCOperand_getImm(op);
  uVar9 = (uint)(uVar5 >> 6);
  uVar4 = (uint)uVar5 & 0x3f;
  uVar6 = (uVar9 & 0x40 | uVar4) ^ 0x3f;
  iVar7 = -1;
  do {
    iVar8 = iVar7 + 1;
    if (iVar7 == 0x1d) break;
    uVar6 = uVar6 * 2;
    iVar7 = iVar8;
  } while (-1 < (int)uVar6);
  uVar6 = 0x40000000 >> ((byte)iVar8 & 0x1f);
  bVar3 = (byte)(uVar6 - 1);
  uVar5 = ~(-1L << (((byte)uVar4 & bVar3) + 1 & 0x3f));
  for (uVar9 = uVar9 & 0x3ffffff & uVar6 - 1 & 0x3f; uVar9 != 0; uVar9 = uVar9 - 1) {
    uVar5 = uVar5 >> 1 | (ulong)((uint)uVar5 & 1) << (bVar3 & 0x3f);
  }
  if (iVar8 != 0x19) {
    do {
      uVar5 = uVar5 | uVar5 << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 * 2;
    } while (uVar6 != 0x20);
  }
  printUInt32Bang(O,(uint32_t)uVar5);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)(int)(uint32_t)uVar5;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printLogicalImm32(MCInst *MI, unsigned OpNum, SStream *O)
{
	int64_t Val = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	Val = AArch64_AM_decodeLogicalImmediate(Val, 32);
	printUInt32Bang(O, (int)Val);

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}